

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StorageReaderTests.cpp
# Opt level: O3

int testStorageReaderTestsRawData(void)

{
  pointer pcVar1;
  string *psVar2;
  ostream *poVar3;
  pointer ptVar4;
  pointer pFVar5;
  difference_type __d2;
  int iVar6;
  undefined1 auVar7 [16];
  Span<const_unsigned_char,_18446744073709551615UL> SVar8;
  initializer_list<unsigned_char> __l;
  initializer_list<MILBlob::Fp16> __l_00;
  initializer_list<unsigned_int> __l_01;
  vector<unsigned_char,_std::allocator<unsigned_char>_> expectedValues;
  StorageReader reader;
  AutoDeleteTempFile tempfile;
  allocator_type local_89;
  vector<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_> local_88;
  StorageReader local_70;
  string local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  AutoDeleteTempFile local_38;
  
  MILBlob::TestUtil::MakeStorageTempFileWith3Records();
  psVar2 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&local_38);
  pcVar1 = (psVar2->_M_dataplus)._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + psVar2->_M_string_length);
  MILBlob::Blob::StorageReader::StorageReader(&local_70,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  SVar8 = MILBlob::Blob::StorageReader::GetRawDataView(&local_70,0x40);
  if (SVar8.m_size.m_size.m_size != 5) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageReaderTests.cpp"
               ,0x7a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x108);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(data.Size()) == (size_t(5))",0x1c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    iVar6 = 1;
    std::ostream::flush();
    goto LAB_001c4506;
  }
  local_48 = CONCAT35(local_48._5_3_,0x700400002);
  __l._M_len = 5;
  __l._M_array = (iterator)&local_48;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_88,__l,&local_89);
  if ((long)local_88.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_88.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl.
            super__Vector_impl_data._M_start == 5) {
    pFVar5 = (pointer)0x0;
    if (local_88.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_88.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl.
        super__Vector_impl_data._M_start) {
      pFVar5 = local_88.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    if ((char)*(int *)((long)SVar8.m_ptr + 4) != (char)pFVar5[2].bytes ||
        *(int *)SVar8.m_ptr != *(int *)pFVar5) goto LAB_001c4392;
    if (local_88.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_88.
                            super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.
                            super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    SVar8 = MILBlob::Blob::StorageReader::GetRawDataView(&local_70,0xc0);
    if (SVar8.m_size.m_size.m_size != 8) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageReaderTests.cpp"
                 ,0x7a);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x110);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(data.Size()) == (size_t(8))",0x1c)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      iVar6 = 1;
      std::ostream::flush();
      goto LAB_001c4506;
    }
    local_48 = 0x810c0fe000e;
    __l_00._M_len = 4;
    __l_00._M_array = (iterator)&local_48;
    std::vector<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>::vector
              (&local_88,__l_00,(allocator_type *)&local_89);
    if ((long)local_88.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_88.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl.
              super__Vector_impl_data._M_start == 8) {
      pFVar5 = (pointer)0x0;
      if (local_88.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_88.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl.
          super__Vector_impl_data._M_start) {
        pFVar5 = local_88.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      if (*(long *)SVar8.m_ptr == *(long *)pFVar5) {
        if (local_88.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_88.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_88.
                                super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_88.
                                super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        SVar8 = MILBlob::Blob::StorageReader::GetRawDataView(&local_70,0x140);
        ptVar4 = SVar8.m_ptr;
        if (SVar8.m_size.m_size.m_size != 0x10) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageReaderTests.cpp"
                     ,0x7a);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x118);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar3,"(data.Size()) == (size_t(16))",0x1d);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar3," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          iVar6 = 1;
          std::ostream::flush();
          goto LAB_001c4506;
        }
        local_48 = 0xc0fee00700000;
        uStack_40 = 0x91fade0008face;
        __l_01._M_len = 4;
        __l_01._M_array = (iterator)&local_48;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88,__l_01,
                   (allocator_type *)&local_89);
        if ((long)local_88.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_88.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl
                  .super__Vector_impl_data._M_start == 0x10) {
          iVar6 = 0;
          pFVar5 = (pointer)0x0;
          if (local_88.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_88.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl.
              super__Vector_impl_data._M_start) {
            pFVar5 = local_88.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          }
          auVar7[0] = -((type)pFVar5->bytes == *ptVar4);
          auVar7[1] = -(*(type *)((long)&pFVar5->bytes + 1) == ptVar4[1]);
          auVar7[2] = -((type)pFVar5[1].bytes == ptVar4[2]);
          auVar7[3] = -(*(type *)((long)&pFVar5[1].bytes + 1) == ptVar4[3]);
          auVar7[4] = -((type)pFVar5[2].bytes == ptVar4[4]);
          auVar7[5] = -(*(type *)((long)&pFVar5[2].bytes + 1) == ptVar4[5]);
          auVar7[6] = -((type)pFVar5[3].bytes == ptVar4[6]);
          auVar7[7] = -(*(type *)((long)&pFVar5[3].bytes + 1) == ptVar4[7]);
          auVar7[8] = -((type)pFVar5[4].bytes == ptVar4[8]);
          auVar7[9] = -(*(type *)((long)&pFVar5[4].bytes + 1) == ptVar4[9]);
          auVar7[10] = -((type)pFVar5[5].bytes == ptVar4[10]);
          auVar7[0xb] = -(*(type *)((long)&pFVar5[5].bytes + 1) == ptVar4[0xb]);
          auVar7[0xc] = -((type)pFVar5[6].bytes == ptVar4[0xc]);
          auVar7[0xd] = -(*(type *)((long)&pFVar5[6].bytes + 1) == ptVar4[0xd]);
          auVar7[0xe] = -((type)pFVar5[7].bytes == ptVar4[0xe]);
          auVar7[0xf] = -(*(type *)((long)&pFVar5[7].bytes + 1) == ptVar4[0xf]);
          if ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                      (ushort)(auVar7[0xf] >> 7) << 0xf) != 0xffff) goto LAB_001c4796;
        }
        else {
LAB_001c4796:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageReaderTests.cpp"
                     ,0x7a);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x11b);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar3,
                     "std::equal(data.begin(), data.end(), Util::SpanCast<uint8_t>(Util::MakeSpan(expectedValues)).begin(), Util::SpanCast<uint8_t>(Util::MakeSpan(expectedValues)).end())"
                     ,0xa4);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar3," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
          iVar6 = 1;
        }
        if (local_88.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_88.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_88.
                                super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_88.
                                super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        goto LAB_001c4506;
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageReaderTests.cpp"
               ,0x7a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x113);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,
               "std::equal(data.begin(), data.end(), Util::SpanCast<const uint8_t>(Util::MakeSpan(expectedValues)).begin(), Util::SpanCast<const uint8_t>(Util::MakeSpan(expectedValues)).end())"
               ,0xb0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  else {
LAB_001c4392:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageReaderTests.cpp"
               ,0x7a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x10b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,
               "std::equal(data.begin(), data.end(), Util::MakeSpan(expectedValues).begin(), Util::MakeSpan(expectedValues).end())"
               ,0x72);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  if (local_88.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  iVar6 = 1;
LAB_001c4506:
  MILBlob::Blob::StorageReader::~StorageReader(&local_70);
  MILBlob::TestUtil::AutoDeleteTempFile::~AutoDeleteTempFile(&local_38);
  return iVar6;
}

Assistant:

int testStorageReaderTestsRawData()
{
    auto tempfile = TestUtil::MakeStorageTempFileWith3Records();

    StorageReader reader(tempfile.GetFilename());

    {  // read uint8_t weights from metadata 1
        const auto data = reader.GetRawDataView(64);
        ML_ASSERT_EQ(data.Size(), size_t(5));

        std::vector<uint8_t> expectedValues = {0x02, 0x00, 0x40, 0x00, 0x07};
        ML_ASSERT_SPAN_EQ(data, Util::MakeSpan(expectedValues));
    }

    {  // read Fp16 weights from metadata 2
        auto data = reader.GetRawDataView(192);
        ML_ASSERT_EQ(data.Size(), size_t(8));

        std::vector<Fp16> expectedValues = {Fp16(0x000E), Fp16(0xC0FE), Fp16(0x0810), Fp16(0x0000)};
        ML_ASSERT_SPAN_EQ(data, Util::SpanCast<const uint8_t>(Util::MakeSpan(expectedValues)));
    }

    {  // read float weights from metadata 3
        auto data = reader.GetRawDataView(320);
        ML_ASSERT_EQ(data.Size(), size_t(16));

        std::vector<uint32_t> expectedValues = {0x700000, 0xC0FEE, 0x8FACE, 0x91FADE};
        ML_ASSERT_SPAN_EQ(data, Util::SpanCast<uint8_t>(Util::MakeSpan(expectedValues)));
    }

    return 0;
}